

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_defineProperties(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar2;
  JSValue obj;
  JSContext *in_stack_00000040;
  undefined1 in_stack_00000048 [16];
  undefined1 in_stack_00000058 [16];
  undefined1 local_10 [16];
  
  JVar2 = *in_R8;
  iVar1 = JS_ObjectDefineProperties
                    (in_stack_00000040,(JSValue)in_stack_00000058,(JSValue)in_stack_00000048);
  if (iVar1 == 0) {
    local_10 = (undefined1  [16])JS_DupValue(in_RDI,JVar2);
  }
  else {
    local_10._0_8_ = local_10._4_8_ << 0x20;
    local_10._8_8_ = 6;
  }
  JVar2.u = (JSValueUnion)local_10._0_8_;
  JVar2.tag = local_10._8_8_;
  return JVar2;
}

Assistant:

static JSValue js_object_defineProperties(JSContext *ctx, JSValueConst this_val,
                                          int argc, JSValueConst *argv)
{
    // defineProperties(obj, properties)
    JSValueConst obj = argv[0];

    if (JS_ObjectDefineProperties(ctx, obj, argv[1]))
        return JS_EXCEPTION;
    else
        return JS_DupValue(ctx, obj);
}